

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O0

thread * __thiscall jessilib::thread_pool::inactive_thread(thread_pool *this)

{
  bool bVar1;
  reference pptVar2;
  thread *result;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  thread_pool *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_inactive_threads_mutex);
  bVar1 = std::
          queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
          ::empty(&this->m_inactive_threads);
  if (bVar1) {
    this_local = (thread_pool *)0x0;
  }
  else {
    pptVar2 = std::
              queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
              ::front(&this->m_inactive_threads);
    this_local = (thread_pool *)*pptVar2;
    std::
    queue<jessilib::thread_pool::thread_*,_std::deque<jessilib::thread_pool::thread_*,_std::allocator<jessilib::thread_pool::thread_*>_>_>
    ::pop(&this->m_inactive_threads);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return (thread *)this_local;
}

Assistant:

thread_pool::thread* thread_pool::inactive_thread() {
	std::lock_guard<std::mutex> guard(m_inactive_threads_mutex);

	if (!m_inactive_threads.empty()) {
		thread* result = m_inactive_threads.front();
		m_inactive_threads.pop();
		return result;
	}

	return nullptr;
}